

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O0

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::extract_solution
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,vector<int,_std::allocator<int>_> *_dem,int T)

{
  size_t *this_00;
  allocator<int> *this_01;
  mapped_type mVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  mapped_type *pmVar5;
  iterator __first;
  iterator __last;
  mapped_type *pmVar6;
  reference __k;
  mapped_type *pmVar7;
  size_type sVar8;
  runtime_error *this_02;
  mapped_type *__a;
  mapped_type *__b;
  int *piVar9;
  mapped_type *pmVar10;
  int local_344;
  int local_340;
  int lbl;
  int u_1;
  Arc a_1;
  pattern_int *patt;
  int local_308;
  int local_304;
  int v_1;
  int local_2fc;
  int f;
  int mf;
  char _error_msg_ [256];
  Arc *a;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  Arc *p;
  int *val;
  int *v_2;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> dp;
  map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_> pred;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  sol;
  undefined1 local_118 [8];
  vector<int,_std::allocator<int>_> lst;
  int *zflow;
  int local_b8;
  int local_b4;
  int v;
  int u;
  pair<const_Arc,_int> *kvpair;
  iterator __end1;
  iterator __begin1;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *__range1;
  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
  adj;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  vector<int,_std::allocator<int>_> *dem;
  vector<int,_std::allocator<int>_> *pvStack_20;
  int T_local;
  vector<int,_std::allocator<int>_> *_dem_local;
  ArcflowSol *this_local;
  
  dem._4_4_ = T;
  pvStack_20 = _dem;
  _dem_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (ArcflowSol *)__return_storage_ptr__;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &adj._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
  ::map((map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
         *)&__range1);
  __end1 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::begin
                     (&this->flow);
  kvpair = (pair<const_Arc,_int> *)
           std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::end
                     (&this->flow);
  while (bVar4 = std::operator!=(&__end1,(_Self *)&kvpair), bVar4) {
    _v = std::_Rb_tree_iterator<std::pair<const_Arc,_int>_>::operator*(&__end1);
    local_b4 = (_v->first).u;
    local_b8 = (_v->first).v;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &adj._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_b4);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &adj._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_b8);
    if (local_b8 != this->S) {
      pmVar7 = std::
               map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
               ::operator[]((map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
                             *)&__range1,&local_b8);
      std::vector<Arc,_std::allocator<Arc>_>::push_back(pmVar7,&_v->first);
    }
    std::_Rb_tree_iterator<std::pair<const_Arc,_int>_>::operator++(&__end1);
  }
  Arc::Arc((Arc *)((long)&lst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 4),(int *)((long)&dem + 4),
           &this->S,this->LOSS);
  pmVar5 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
           operator[](&this->flow,
                      (key_type *)
                      ((long)&lst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
  this_00 = &adj._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  this_01 = (allocator<int> *)
            ((long)&sol.
                    super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_01);
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)local_118,
             (_Rb_tree_const_iterator<int>)__first._M_node,
             (_Rb_tree_const_iterator<int>)__last._M_node,this_01);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&sol.
                     super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::vector((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
            *)&pred._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::map
              ((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_> *)
               &dp._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &__range2);
    mVar1 = *pmVar5;
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&__range2,&this->S);
    *pmVar6 = mVar1;
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_118);
    v_2 = (int *)std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_118);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&v_2), bVar4) {
      __k = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (&__end2);
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&__range2,__k);
      pmVar10 = std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::
                operator[]((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                            *)&dp._M_t._M_impl.super__Rb_tree_header._M_node_count,__k);
      pmVar7 = std::
               map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
               ::operator[]((map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
                             *)&__range1,__k);
      __end3 = std::vector<Arc,_std::allocator<Arc>_>::begin(pmVar7);
      a = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(pmVar7);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>
                                         *)&a), bVar4) {
        _error_msg_._248_8_ =
             __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator*
                       (&__end3);
        sVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                count((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &__range2,(key_type *)_error_msg_._248_8_);
        if (sVar8 == 0) {
          snprintf((char *)&f,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "dp.count(a.u) != 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                   ,0x84);
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,(char *)&f);
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __a = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&__range2,(key_type *)_error_msg_._248_8_);
        __b = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
              operator[](&this->flow,(key_type *)_error_msg_._248_8_);
        piVar9 = std::min<int>(__a,__b);
        local_2fc = *piVar9;
        if (*pmVar6 < local_2fc) {
          uVar2 = *(undefined8 *)_error_msg_._248_8_;
          pmVar10->u = (int)uVar2;
          pmVar10->v = (int)((ulong)uVar2 >> 0x20);
          pmVar10->label = *(int *)(_error_msg_._248_8_ + 8);
          *pmVar6 = local_2fc;
        }
        __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator++
                  (&__end3);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&__range2,(key_type *)((long)&dem + 4));
    v_1 = *pmVar6;
    *pmVar5 = *pmVar5 - v_1;
    if (v_1 == 0) {
      local_304 = 5;
    }
    else {
      local_308 = dem._4_4_;
      std::pair<int,_std::vector<int,_std::allocator<int>_>_>::
      pair<int,_std::vector<int,_std::allocator<int>_>,_true>
                ((pair<int,_std::vector<int,_std::allocator<int>_>_> *)&patt);
      std::
      vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::push_back((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)&pred._M_t._M_impl.super__Rb_tree_header._M_node_count,(value_type *)&patt);
      std::pair<int,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<int,_std::vector<int,_std::allocator<int>_>_> *)&patt);
      a_1._4_8_ = std::
                  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::back((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)&pred._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ((reference)a_1._4_8_)->first = v_1;
      while (local_308 != this->S) {
        pmVar10 = std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::
                  operator[]((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                              *)&dp._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_308);
        lbl = pmVar10->u;
        unique0x00012004 = pmVar10->v;
        local_344 = pmVar10->label;
        local_340 = lbl;
        a_1.u = local_344;
        if (local_344 != this->LOSS) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(a_1._4_8_ + 8),&local_344);
        }
        iVar3 = v_1;
        pmVar6 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
                 operator[](&this->flow,(key_type *)&lbl);
        *pmVar6 = *pmVar6 - iVar3;
        local_308 = local_340;
      }
      local_304 = 0;
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &__range2);
    std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::~map
              ((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_> *)
               &dp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  } while (local_304 == 0);
  remove_excess(__return_storage_ptr__,this,
                (vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&pred._M_t._M_impl.super__Rb_tree_header._M_node_count,_dem);
  local_304 = 1;
  std::
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)&pred._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_118);
  std::
  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
  ::~map((map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
          *)&__range1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &adj._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

std::vector<pattern_pair> ArcflowSol::extract_solution(std::vector<int> *_dem, int T) {
	std::vector<int> &dem = *_dem;
	std::set<int> nodes;
	std::map<int, std::vector<Arc>> adj;
	for (const auto &kvpair : flow) {
		int u = kvpair.first.u;
		int v = kvpair.first.v;
		nodes.insert(u);
		nodes.insert(v);
		if (v != S) {
			adj[v].push_back(kvpair.first);
		}
	}

	int &zflow = flow[Arc(T, S, LOSS)];

	std::vector<int> lst(all(nodes));

	std::vector<pattern_int> sol;
	while (true) {
		std::map<int, Arc> pred;
		std::map<int, int> dp;
		dp[S] = zflow;
		for (const int &v : lst) {
			int &val = dp[v];
			Arc &p = pred[v];
			for (const Arc &a : adj[v]) {
				throw_assert(dp.count(a.u) != 0);
				int mf = std::min(dp[a.u], flow[a]);
				if (mf > val) {
					p = a;
					val = mf;
				}
			}
		}
		int f = dp[T];
		zflow -= f;
		if (f == 0) {
			break;
		}
		int v = T;
		sol.push_back(pattern_int());
		pattern_int &patt = sol.back();
		patt.first = f;
		while (v != S) {
			Arc a = pred[v];
			int u = a.u;
			int lbl = a.label;
			if (lbl != LOSS) {
				patt.second.push_back(lbl);
			}
			flow[a] -= f;
			v = u;
		}
	}
	return remove_excess(sol, &dem);
}